

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::visit_null
          (basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this,
          semantic_tag param_1,ser_context *param_2,error_code *param_3)

{
  size_t *psVar1;
  pointer peVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    if (peVar2[-1].type_ == array) {
      begin_scalar_value(this);
      peVar2 = (this->stack_).
               super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if ((peVar2[-1].line_splits_ != multi_line) &&
       ((this->options_).line_length_limit_ <= this->column_)) {
      peVar2[-1].new_line_after_ = true;
      new_line(this);
    }
  }
  bVar3 = null_constant();
  bVar4 = null_constant();
  stream_sink<char>::append(&this->sink_,bVar3._M_str,bVar4._M_len);
  bVar3 = null_constant();
  this->column_ = this->column_ + bVar3._M_len;
  peVar2 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->stack_).
      super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
      ._M_impl.super__Vector_impl_data._M_start != peVar2) {
    psVar1 = &peVar2[-1].count_;
    *psVar1 = *psVar1 + 1;
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_null(semantic_tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }

            sink_.append(null_constant().data(), null_constant().size());
            column_ += null_constant().size();

            end_value();
            JSONCONS_VISITOR_RETURN;
        }